

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_tags.cpp
# Opt level: O2

void __thiscall FTagManager::AddLineID(FTagManager *this,int line,int tag)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  int *piVar5;
  FTagItem it;
  FTagItem local_34;
  
  if (tag != -1) {
    while ((this->startForLine).Count <= (uint)line) {
      local_34.target = -1;
      TArray<int,_int>::Push(&this->startForLine,&local_34.target);
    }
    piVar5 = (this->startForLine).Array;
    uVar3 = (ulong)(uint)piVar5[line];
    uVar1 = (this->allIDs).Count;
    if (uVar3 == 0xffffffff) {
      piVar5[line] = uVar1;
LAB_004553f5:
      local_34.nexttag = -1;
      local_34.target = line;
      local_34.tag = tag;
      TArray<FTagItem,_FTagItem>::Push(&this->allIDs,&local_34);
    }
    else {
      uVar4 = uVar3 - 1;
      piVar5 = &(this->allIDs).Array[uVar3].tag;
      do {
        uVar4 = uVar4 + 1;
        if (uVar1 <= uVar4) goto LAB_004553f5;
        iVar2 = *piVar5;
        piVar5 = piVar5 + 3;
      } while (iVar2 != tag);
    }
  }
  return;
}

Assistant:

void FTagManager::AddLineID(int line, int tag)
{
	if (tag == -1) return;	// For line IDs -1 means 'not set', unlike sectors.

	// This function assumes that all ids for a single line get added sequentially.
	while (startForLine.Size() <= (unsigned int)line)
	{
		startForLine.Push(-1);
	}
	if (startForLine[line] == -1)
	{
		startForLine[line] = allIDs.Size();
	}
	else
	{
		// check if the key was already defined
		for (unsigned i = startForLine[line]; i < allIDs.Size(); i++)
		{
			if (allIDs[i].tag == tag)
			{
				return;
			}
		}
	}
	FTagItem it = { line, tag, -1 };
	allIDs.Push(it);
}